

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniSubFailure_Test::~TApp_IniSubFailure_Test(TApp_IniSubFailure_Test *this)

{
  TApp_IniSubFailure_Test *this_local;
  
  ~TApp_IniSubFailure_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniSubFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.add_subcommand("other");
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[other]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}